

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

tnt_stream * tnt_object(tnt_stream *s)

{
  tnt_stream *s_00;
  undefined8 *puVar1;
  void *pvVar2;
  
  s_00 = tnt_buf(s);
  if (s_00 != (tnt_stream *)0x0) {
    pvVar2 = s_00->data;
    *(code **)((long)pvVar2 + 0x20) = tnt_sbuf_object_resize;
    puVar1 = (undefined8 *)tnt_mem_alloc(0x10);
    if (puVar1 != (undefined8 *)0x0) {
      *(code **)((long)pvVar2 + 0x28) = tnt_sbuf_object_free;
      *(undefined8 **)((long)pvVar2 + 0x30) = puVar1;
      *(undefined2 *)(puVar1 + 1) = 0x800;
      pvVar2 = tnt_mem_alloc(0x80);
      *puVar1 = pvVar2;
      if (pvVar2 != (void *)0x0) {
        if (s_00->wrcnt != 0) {
          return s_00;
        }
        *(undefined4 *)(*(long *)((long)s_00->data + 0x30) + 0xc) = 0;
        return s_00;
      }
    }
  }
  tnt_stream_free(s_00);
  return (tnt_stream *)0x0;
}

Assistant:

struct tnt_stream *
tnt_object(struct tnt_stream *s)
{
	if ((s = tnt_buf(s)) == NULL)
		goto error;

	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	sb->resize = tnt_sbuf_object_resize;

	struct tnt_sbuf_object *sbo = tnt_mem_alloc(sizeof(struct tnt_sbuf_object));
	if (sbo == NULL)
		goto error;
	sb->free = tnt_sbuf_object_free;
	sb->subdata = sbo;
	sbo->stack_size = 0;
	sbo->stack_alloc = 8;
	sbo->stack = tnt_mem_alloc(sbo->stack_alloc *
			sizeof(struct tnt_sbo_stack));
	if (sbo->stack == NULL)
		goto error;
	tnt_object_type(s, TNT_SBO_SIMPLE);

	return s;
error:
	tnt_stream_free(s);
	return NULL;
}